

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfCloseOutputFile(ImfOutputFile *out)

{
  RgbaOutputFile *pRVar1;
  ImfOutputFile *in_RDI;
  exception *e;
  
  pRVar1 = anon_unknown.dwarf_70604::outfile(in_RDI);
  if (pRVar1 != (RgbaOutputFile *)0x0) {
    (*pRVar1->_vptr_RgbaOutputFile[1])();
  }
  return 1;
}

Assistant:

int
ImfCloseOutputFile (ImfOutputFile* out)
{
    try
    {
        delete outfile (out);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}